

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncryptAes256KeyEmpty_Test::~CryptoUtil_EncryptAes256KeyEmpty_Test
          (CryptoUtil_EncryptAes256KeyEmpty_Test *this)

{
  CryptoUtil_EncryptAes256KeyEmpty_Test *this_local;
  
  ~CryptoUtil_EncryptAes256KeyEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256KeyEmpty) {
  try {
    std::vector<uint8_t> key;
    ByteData byte_data = CryptoUtil::EncryptAes256(key, "test test test test");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "EncryptAes256 key size error.");
    return;
  }
  ASSERT_TRUE(false);
}